

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UT_OK.cpp
# Opt level: O3

void __thiscall copy_no_default5::test_method(copy_no_default5 *this)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  assertion_result local_1f8;
  char ***local_1e0;
  undefined **local_1d8;
  ulong uStack_1d0;
  undefined8 *local_1c8;
  vector<int,_std::allocator<int>_> *local_1c0;
  vector<int,_std::allocator<int>_> e;
  undefined1 *local_1a0;
  undefined1 *local_198;
  shared_count sStack_190;
  vector<int,_std::allocator<int>_> b;
  int a;
  vector<int,_std::allocator<int>_> v;
  undefined1 **local_150;
  char *local_148;
  vector<int,_std::allocator<int>_> x;
  undefined **local_128;
  char *local_120;
  undefined8 *local_118;
  char *local_110;
  double d;
  char *c;
  undefined1 *local_f8;
  undefined1 *local_f0;
  double *local_e8;
  char *local_e0;
  char *local_d8;
  undefined8 local_d0;
  char *local_c8;
  undefined1 *local_c0;
  char **local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char **local_98;
  undefined1 *local_90;
  int *local_88;
  char *local_80;
  undefined8 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_1d8 = (undefined **)0x200000001;
  uStack_1d0 = 0x400000003;
  local_1c8._0_4_ = 5;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_1d8;
  std::vector<int,_std::allocator<int>_>::vector(&v,__l,(allocator_type *)&local_1f8);
  local_1d8 = (undefined **)0xc0000000b;
  uStack_1d0 = 0xe0000000d;
  local_1c8 = (undefined8 *)CONCAT44(local_1c8._4_4_,0xf);
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_1d8;
  std::vector<int,_std::allocator<int>_>::vector(&x,__l_00,(allocator_type *)&local_1f8);
  a = 0x2a;
  std::vector<int,_std::allocator<int>_>::vector(&b,&v);
  c = "foo";
  d = 12.5;
  std::vector<int,_std::allocator<int>_>::vector(&e,&x);
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_d8 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x85);
  local_120 = (char *)((ulong)local_120 & 0xffffffffffffff00);
  local_128 = &PTR__lazy_ostream_00115a30;
  local_118 = &boost::unit_test::lazy_ostream::inst;
  local_110 = "";
  local_88 = &a;
  local_98 = &local_a8;
  local_a8 = (char *)CONCAT44(local_a8._4_4_,0x2a);
  local_198 = (undefined1 *)0x0;
  sStack_190.pi_ = (sp_counted_base *)0x0;
  local_150 = (undefined1 **)0x111086;
  local_148 = "";
  local_1c0 = (vector<int,_std::allocator<int>_> *)&local_88;
  uStack_1d0 = uStack_1d0 & 0xffffffffffffff00;
  local_1d8 = &PTR__lazy_ostream_00115a80;
  local_1c8 = &boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_98;
  local_1f8.m_message.px._0_1_ = 0;
  local_1f8._0_8_ = &PTR__lazy_ostream_00115a80;
  local_1f8.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_1a0._0_1_ = a == 0x2a;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_190);
  local_88 = (int *)0x111086;
  local_80 = "";
  local_98 = (char **)&boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_88,0x88);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            (&local_1f8,(equal_coll_impl *)&local_128,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      b.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  uStack_1d0 = uStack_1d0 & 0xffffffffffffff00;
  local_1d8 = &PTR__lazy_ostream_00115a30;
  local_1c8 = &boost::unit_test::lazy_ostream::inst;
  local_1c0 = (vector<int,_std::allocator<int>_> *)0x111356;
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_a0 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_1f8,&local_1d8,&local_a8,0x88,1,0xd,4,"std::begin(b)","std::end(b)",
             "std::begin(v)","std::end(v)");
  boost::detail::shared_count::~shared_count(&local_1f8.m_message.pn);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x89);
  local_120 = (char *)((ulong)local_120 & 0xffffffffffffff00);
  local_128 = &PTR__lazy_ostream_00115a30;
  local_118 = &boost::unit_test::lazy_ostream::inst;
  local_110 = "";
  boost::test_tools::tt_detail::equal_impl((char *)&local_1a0,"foo");
  local_150 = (undefined1 **)0x111086;
  local_148 = "";
  local_b8 = &c;
  local_1c0 = (vector<int,_std::allocator<int>_> *)&local_b8;
  uStack_1d0 = uStack_1d0 & 0xffffffffffffff00;
  local_1d8 = &PTR__lazy_ostream_00115c40;
  local_1c8 = &boost::unit_test::lazy_ostream::inst;
  local_1e0 = (char ***)&local_c8;
  local_c8 = "foo";
  local_1f8.m_message.px._0_1_ = 0;
  local_1f8._0_8_ = &PTR__lazy_ostream_00115b00;
  local_1f8.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_128,&local_150,0x89,1,2,2,"c",&local_1d8,"\"foo\"",&local_1f8);
  boost::detail::shared_count::~shared_count(&sStack_190);
  local_b8 = (char **)0x111086;
  local_b0 = "";
  local_c8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b8,0x8a);
  local_120 = (char *)((ulong)local_120 & 0xffffffffffffff00);
  local_128 = &PTR__lazy_ostream_00115a30;
  local_118 = &boost::unit_test::lazy_ostream::inst;
  local_110 = "";
  local_78 = &local_d0;
  local_d0 = 0x4029000000000000;
  local_1a0 = (undefined1 *)CONCAT71(local_1a0._1_7_,1);
  local_198 = (undefined1 *)0x0;
  sStack_190.pi_ = (sp_counted_base *)0x0;
  local_150 = (undefined1 **)0x111086;
  local_148 = "";
  local_e8 = &d;
  local_1c0 = (vector<int,_std::allocator<int>_> *)&local_e8;
  uStack_1d0 = uStack_1d0 & 0xffffffffffffff00;
  local_1d8 = &PTR__lazy_ostream_00115b80;
  local_1c8 = &boost::unit_test::lazy_ostream::inst;
  local_1e0 = (char ***)&local_78;
  local_1f8.m_message.px._0_1_ = 0;
  local_1f8._0_8_ = &PTR__lazy_ostream_00115b80;
  local_1f8.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_190);
  local_128 = (undefined **)0x111086;
  local_120 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_128,0x8d,&local_1a0);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            (&local_1f8,(equal_coll_impl *)&local_e8,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             e.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      e.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                      x.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  uStack_1d0 = uStack_1d0 & 0xffffffffffffff00;
  local_1d8 = &PTR__lazy_ostream_00115a30;
  local_1c8 = &boost::unit_test::lazy_ostream::inst;
  local_1c0 = (vector<int,_std::allocator<int>_> *)0x111356;
  local_150 = (undefined1 **)0x111086;
  local_148 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_1f8,&local_1d8,&local_150,0x8d,1,0xd,4,"std::begin(e)","std::end(e)",
             "std::begin(x)","std::end(x)");
  boost::detail::shared_count::~shared_count(&local_1f8.m_message.pn);
  local_1d8._0_4_ = 0x2a;
  if (b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish ==
      b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&b,(iterator)
                  b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish,(int *)&local_1d8);
  }
  else {
    *b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         0x2a;
    b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish +
         1;
  }
  local_1d8 = (undefined **)CONCAT44(local_1d8._4_4_,0x2a);
  if (e.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish ==
      e.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&e,(iterator)
                  e.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish,(int *)&local_1d8);
  }
  else {
    *e.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         0x2a;
    e.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         e.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish +
         1;
  }
  if (e.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(e.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)e.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)e.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)b.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)b.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x95);
  local_120 = (char *)((ulong)local_120 & 0xffffffffffffff00);
  local_128 = &PTR__lazy_ostream_00115a30;
  local_118 = &boost::unit_test::lazy_ostream::inst;
  local_110 = "";
  local_e0 = (char *)((long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2);
  local_f8 = (undefined1 *)CONCAT44(local_f8._4_4_,5);
  local_1a0 = (undefined1 *)
              CONCAT71(local_1a0._1_7_,
                       (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start == 0x14);
  local_198 = (undefined1 *)0x0;
  sStack_190.pi_ = (sp_counted_base *)0x0;
  b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)anon_var_dwarf_8049;
  b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x1110eb;
  e.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_e0;
  uStack_1d0 = uStack_1d0 & 0xffffffffffffff00;
  local_1d8 = &PTR__lazy_ostream_00115d30;
  local_1c8 = &boost::unit_test::lazy_ostream::inst;
  local_1f8.m_message.px._0_1_ = 0;
  local_1f8._0_8_ = &PTR__lazy_ostream_00115a80;
  local_1f8.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_150;
  local_1c0 = &e;
  local_150 = &local_f8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_190);
  if (x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)x.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)x.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(copy_no_default5)
{
    auto       v = std::vector<int>{ 1, 2, 3, 4, 5};
    auto const x = std::vector<int>{ 11, 12, 13, 14, 15};
    f_copy_no_default5(
            [&](auto&& a, auto&& b, auto&& c, auto&& d, auto&& e) {
            BOOST_CHECK_EQUAL(a, 42);
            BOOST_CHECK_EQUAL_COLLECTIONS(
                    std::begin(b), std::end(b),
                    std::begin(v), std::end(v));
            BOOST_CHECK_EQUAL(c, "foo");
            BOOST_CHECK_EQUAL(d, 12.5);
            BOOST_CHECK_EQUAL_COLLECTIONS(
                    std::begin(e), std::end(e),
                    std::begin(x), std::end(x));
            },
            "a"_na=42,
            "b"_na=v,
            "c"_na="foo",
            "d"_na=12.5,
            "e"_na=x
            );
    BOOST_CHECK_EQUAL(v.size(), 5); // check v was copied
}